

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_f7a406::RNGState::MixExtract
          (RNGState *this,uchar *out,size_t num,CSHA512 *hasher,bool strong_seed,
          bool always_use_real_rng)

{
  long lVar1;
  Span<unsigned_char> s;
  Span<std::byte> out_00;
  bool bVar2;
  ChaCha20 *begin;
  byte bVar3;
  uchar *in_RCX;
  ulong in_RDX;
  char *in_RSI;
  char *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  long in_FS_OFFSET;
  bool ret;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  uchar buf [64];
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  uchar *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar4;
  int nLine;
  char *pszFile;
  undefined1 in_stack_ffffffffffffff60 [16];
  bool local_8b;
  ChaCha20 *in_stack_ffffffffffffff98;
  undefined1 local_48 [32];
  undefined8 local_28;
  byte *in_stack_ffffffffffffffe0;
  size_t in_stack_ffffffffffffffe8;
  undefined8 local_10;
  
  uVar4 = (undefined4)in_RDX;
  nLine = (int)(in_RDX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = (byte)in_R8D;
  if (0x20 < in_RDX) {
    __assert_fail("num <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/random.cpp"
                  ,0x1e9,
                  "bool (anonymous namespace)::RNGState::MixExtract(unsigned char *, size_t, CSHA512 &&, bool, bool)"
                 );
  }
  pszFile = in_RSI;
  MaybeCheckNotHeld((Mutex *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,in_RDI,pszFile,nLine,
             SUB41((uint)uVar4 >> 0x18,0));
  local_8b = (bool)(in_RDI[0x50] & 1U | bVar3 & 1);
  in_RDI[0x50] = local_8b;
  CSHA512::Write((CSHA512 *)CONCAT44(nLine,uVar4),in_RCX,CONCAT44(in_R8D,in_stack_ffffffffffffff38))
  ;
  CSHA512::Write((CSHA512 *)CONCAT44(nLine,uVar4),in_RCX,CONCAT44(in_R8D,in_stack_ffffffffffffff38))
  ;
  *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 1;
  CSHA512::Finalize((CSHA512 *)CONCAT44(in_R8D,in_stack_ffffffffffffff38),in_stack_ffffffffffffff30)
  ;
  *(undefined8 *)(in_RDI + 0x28) = local_28;
  *(byte **)(in_RDI + 0x30) = in_stack_ffffffffffffffe0;
  *(size_t *)(in_RDI + 0x38) = in_stack_ffffffffffffffe8;
  *(undefined8 *)(in_RDI + 0x40) = local_10;
  if (((in_R9B & 1) == 0) &&
     (bVar2 = std::optional<ChaCha20>::has_value
                        ((optional<ChaCha20> *)
                         CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28)), bVar2)) {
    begin = std::optional<ChaCha20>::operator->
                      ((optional<ChaCha20> *)
                       CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    Span<unsigned_char>::Span<unsigned_char,_0>
              ((Span<unsigned_char> *)CONCAT44(in_R8D,in_stack_ffffffffffffff38),(uchar *)begin,
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    s.m_size._0_4_ = uVar4;
    s.m_data = in_RCX;
    s.m_size._4_4_ = nLine;
    AsWritableBytes<unsigned_char>(s);
    out_00.m_size = in_stack_ffffffffffffffe8;
    out_00.m_data = in_stack_ffffffffffffffe0;
    ChaCha20::Keystream(in_stack_ffffffffffffff98,out_00);
    local_8b = true;
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  if (in_RDX != 0) {
    if (in_RSI == (char *)0x0) {
      __assert_fail("out != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/random.cpp"
                    ,0x203,
                    "bool (anonymous namespace)::RNGState::MixExtract(unsigned char *, size_t, CSHA512 &&, bool, bool)"
                   );
    }
    memcpy(in_RSI,local_48,in_RDX);
  }
  CSHA512::Reset((CSHA512 *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  memory_cleanse((void *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),0x88d0de);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_8b;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        assert(num <= 32);
        unsigned char buf[64];
        static_assert(sizeof(buf) == CSHA512::OUTPUT_SIZE, "Buffer needs to have hasher's output size");
        bool ret;
        {
            LOCK(m_mutex);
            ret = (m_strongly_seeded |= strong_seed);
            // Write the current state of the RNG into the hasher
            hasher.Write(m_state, 32);
            // Write a new counter number into the state
            hasher.Write((const unsigned char*)&m_counter, sizeof(m_counter));
            ++m_counter;
            // Finalize the hasher
            hasher.Finalize(buf);
            // Store the last 32 bytes of the hash output as new RNG state.
            memcpy(m_state, buf + 32, 32);
            // Handle requests for deterministic randomness.
            if (!always_use_real_rng && m_deterministic_prng.has_value()) [[unlikely]] {
                // Overwrite the beginning of buf, which will be used for output.
                m_deterministic_prng->Keystream(AsWritableBytes(Span{buf, num}));
                // Do not require strong seeding for deterministic output.
                ret = true;
            }
        }
        // If desired, copy (up to) the first 32 bytes of the hash output as output.
        if (num) {
            assert(out != nullptr);
            memcpy(out, buf, num);
        }
        // Best effort cleanup of internal state
        hasher.Reset();
        memory_cleanse(buf, 64);
        return ret;
    }